

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

bool __thiscall
vkt::texture::SampleVerifier::verifySampleFiltered
          (SampleVerifier *this,Vec4 *result,IVec3 *baseTexelHiIn,IVec3 *baseTexelLoIn,
          IVec3 *texelGridOffsetHiIn,IVec3 *texelGridOffsetLoIn,int layer,int levelHi,
          Vec2 *lodFracBounds,VkFilter filter,VkSamplerMipmapMode mipmapFilter,ostream *report)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  float *pfVar5;
  int iVar6;
  float fVar7;
  double dVar8;
  int local_1ec;
  Interval local_1e0;
  Interval local_1c8;
  Interval local_1b0;
  Interval local_198;
  Interval local_180;
  undefined1 local_168 [8];
  Interval idealSample;
  Interval idealSampleHi;
  Interval idealSampleLo;
  int compNdx;
  Vec4 idealSampleMax;
  Vec4 idealSampleMin;
  float weight;
  deInt32 lodStep;
  undefined1 local_e8 [8];
  Vec3 roundedWeightsLo;
  undefined1 local_d0 [8];
  Vec3 roundedWeightsHi;
  Vec4 idealSampleLoMax;
  Vec4 idealSampleLoMin;
  Vec4 idealSampleHiMax;
  Vec4 idealSampleHiMin;
  deInt32 lodStepsMax;
  deInt32 lodStepsMin;
  IVec3 texelGridOffsetLo;
  IVec3 texelGridOffsetHi;
  IVec3 baseTexelLo;
  IVec3 baseTexelHi;
  int levelLo;
  int lodSteps;
  int coordSteps;
  IVec3 *texelGridOffsetLoIn_local;
  IVec3 *texelGridOffsetHiIn_local;
  IVec3 *baseTexelLoIn_local;
  IVec3 *baseTexelHiIn_local;
  Vec4 *result_local;
  SampleVerifier *this_local;
  
  iVar6 = 1 << ((byte)this->m_coordBits & 0x1f);
  iVar2 = this->m_mipmapBits;
  if (levelHi < this->m_imParams->levels + -1) {
    local_1ec = levelHi + 1;
  }
  else {
    local_1ec = levelHi;
  }
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(baseTexelLo.m_data + 1),baseTexelHiIn);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(texelGridOffsetHi.m_data + 1),baseTexelLoIn);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(texelGridOffsetLo.m_data + 1),texelGridOffsetHiIn);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&lodStepsMax,texelGridOffsetLoIn);
  idealSampleHiMin.m_data[3] = 0.0;
  idealSampleHiMin.m_data[2] = 0.0;
  getMipmapStepBounds(this,lodFracBounds,(deInt32 *)(idealSampleHiMin.m_data + 3),
                      (deInt32 *)(idealSampleHiMin.m_data + 2));
  poVar4 = std::operator<<(report,"Testing at base texel ");
  poVar4 = tcu::operator<<(poVar4,(Vector<int,_3> *)(baseTexelLo.m_data + 1));
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = tcu::operator<<(poVar4,(Vector<int,_3> *)(texelGridOffsetHi.m_data + 1));
  poVar4 = std::operator<<(poVar4," offset ");
  poVar4 = tcu::operator<<(poVar4,(Vector<int,_3> *)(texelGridOffsetLo.m_data + 1));
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = tcu::operator<<(poVar4,(Vector<int,_3> *)&lodStepsMax);
  std::operator<<(poVar4,"\n");
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(idealSampleHiMax.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(idealSampleLoMin.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(idealSampleLoMax.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(roundedWeightsHi.m_data + 1));
  if (filter == VK_FILTER_LINEAR) {
    util::wrapTexelGridCoordLinear
              ((IVec3 *)(baseTexelLo.m_data + 1),(IVec3 *)(texelGridOffsetLo.m_data + 1),
               this->m_coordBits,this->m_imParams->dim);
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      util::wrapTexelGridCoordLinear
                ((IVec3 *)(texelGridOffsetHi.m_data + 1),(IVec3 *)&lodStepsMax,this->m_coordBits,
                 this->m_imParams->dim);
    }
    tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)(roundedWeightsLo.m_data + 1));
    tcu::operator/((tcu *)local_d0,(Vector<float,_3> *)(roundedWeightsLo.m_data + 1),(float)iVar6);
    tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)&weight);
    tcu::operator/((tcu *)local_e8,(Vector<float,_3> *)&weight,(float)iVar6);
    poVar4 = std::operator<<(report,"Computed weights: ");
    poVar4 = tcu::operator<<(poVar4,(Vector<float,_3> *)local_d0);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = tcu::operator<<(poVar4,(Vector<float,_3> *)local_e8);
    std::operator<<(poVar4,"\n");
    getFilteredSample(this,(IVec3 *)(baseTexelLo.m_data + 1),(Vec3 *)local_d0,layer,levelHi,
                      (Vec4 *)(idealSampleHiMax.m_data + 2),(Vec4 *)(idealSampleLoMin.m_data + 2));
    poVar4 = std::operator<<(report,"Ideal hi sample: ");
    poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealSampleHiMax.m_data + 2));
    poVar4 = std::operator<<(poVar4," through ");
    poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealSampleLoMin.m_data + 2));
    std::operator<<(poVar4,"\n");
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      getFilteredSample(this,(IVec3 *)(texelGridOffsetHi.m_data + 1),(Vec3 *)local_e8,layer,
                        local_1ec,(Vec4 *)(idealSampleLoMax.m_data + 2),
                        (Vec4 *)(roundedWeightsHi.m_data + 1));
      poVar4 = std::operator<<(report,"Ideal lo sample: ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealSampleLoMax.m_data + 2));
      poVar4 = std::operator<<(poVar4," through ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(roundedWeightsHi.m_data + 1));
      std::operator<<(poVar4,"\n");
    }
  }
  else {
    fetchTexel(this,(IVec3 *)(baseTexelLo.m_data + 1),layer,levelHi,VK_FILTER_NEAREST,
               (Vec4 *)(idealSampleHiMax.m_data + 2),(Vec4 *)(idealSampleLoMin.m_data + 2));
    poVar4 = std::operator<<(report,"Ideal hi sample: ");
    poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealSampleHiMax.m_data + 2));
    poVar4 = std::operator<<(poVar4," through ");
    poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealSampleLoMin.m_data + 2));
    std::operator<<(poVar4,"\n");
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      fetchTexel(this,(IVec3 *)(texelGridOffsetHi.m_data + 1),layer,local_1ec,VK_FILTER_NEAREST,
                 (Vec4 *)(idealSampleLoMax.m_data + 2),(Vec4 *)(roundedWeightsHi.m_data + 1));
      poVar4 = std::operator<<(report,"Ideal lo sample: ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealSampleLoMax.m_data + 2));
      poVar4 = std::operator<<(poVar4," through ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(roundedWeightsHi.m_data + 1));
      std::operator<<(poVar4,"\n");
    }
  }
  if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
    for (idealSampleMin.m_data[3] = idealSampleHiMin.m_data[3];
        (int)idealSampleMin.m_data[3] <= (int)idealSampleHiMin.m_data[2];
        idealSampleMin.m_data[3] = (float)((int)idealSampleMin.m_data[3] + 1)) {
      fVar7 = (float)(int)idealSampleMin.m_data[3] / (float)(1 << ((byte)iVar2 & 0x1f));
      poVar4 = std::operator<<(report,"Testing at mipmap weight ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar7);
      std::operator<<(poVar4,"\n");
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(idealSampleMax.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&idealSampleLo.m_hi + 4));
      for (idealSampleLo.m_hi._0_4_ = 0; idealSampleLo.m_hi._0_4_ < 4;
          idealSampleLo.m_hi._0_4_ = idealSampleLo.m_hi._0_4_ + 1) {
        pfVar5 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(idealSampleLoMax.m_data + 2),
                            idealSampleLo.m_hi._0_4_);
        fVar1 = *pfVar5;
        pfVar5 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(roundedWeightsHi.m_data + 1),
                            idealSampleLo.m_hi._0_4_);
        tcu::Interval::Interval((Interval *)&idealSampleHi.m_hi,false,(double)fVar1,(double)*pfVar5)
        ;
        pfVar5 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(idealSampleHiMax.m_data + 2),
                            idealSampleLo.m_hi._0_4_);
        fVar1 = *pfVar5;
        pfVar5 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(idealSampleLoMin.m_data + 2),
                            idealSampleLo.m_hi._0_4_);
        tcu::Interval::Interval((Interval *)&idealSample.m_hi,false,(double)fVar1,(double)*pfVar5);
        tcu::Interval::Interval(&local_1b0,(double)fVar7);
        tcu::operator*(&local_198,&local_1b0,(Interval *)&idealSampleHi.m_hi);
        tcu::Interval::Interval(&local_1e0,(double)(1.0 - fVar7));
        tcu::operator*(&local_1c8,&local_1e0,(Interval *)&idealSample.m_hi);
        tcu::operator+(&local_180,&local_198,&local_1c8);
        tcu::FloatFormat::roundOut
                  ((Interval *)local_168,&this->m_filteringPrecision,&local_180,false);
        dVar8 = tcu::Interval::lo((Interval *)local_168);
        pfVar5 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(idealSampleMax.m_data + 2),idealSampleLo.m_hi._0_4_
                           );
        *pfVar5 = (float)dVar8;
        dVar8 = tcu::Interval::hi((Interval *)local_168);
        pfVar5 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)((long)&idealSampleLo.m_hi + 4),
                            idealSampleLo.m_hi._0_4_);
        *pfVar5 = (float)dVar8;
      }
      poVar4 = std::operator<<(report,"Ideal sample: ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealSampleMax.m_data + 2));
      poVar4 = std::operator<<(poVar4," through ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)((long)&idealSampleLo.m_hi + 4));
      std::operator<<(poVar4,"\n");
      bVar3 = util::isInRange<4>(result,(Vector<float,_4> *)(idealSampleMax.m_data + 2),
                                 (Vector<float,_4> *)((long)&idealSampleLo.m_hi + 4));
      if (bVar3) {
        return true;
      }
      std::operator<<(report,"Failed comparison\n");
    }
  }
  else {
    bVar3 = util::isInRange<4>(result,(Vector<float,_4> *)(idealSampleHiMax.m_data + 2),
                               (Vector<float,_4> *)(idealSampleLoMin.m_data + 2));
    if (bVar3) {
      return true;
    }
    std::operator<<(report,"Failed comparison\n");
  }
  return false;
}

Assistant:

bool SampleVerifier::verifySampleFiltered (const Vec4&			result,
										   const IVec3&			baseTexelHiIn,
										   const IVec3&			baseTexelLoIn,
										   const IVec3&			texelGridOffsetHiIn,
										   const IVec3&			texelGridOffsetLoIn,
										   int					layer,
										   int					levelHi,
										   const Vec2&			lodFracBounds,
										   VkFilter				filter,
										   VkSamplerMipmapMode	mipmapFilter,
										   std::ostream&		report) const
{
	DE_ASSERT(layer < m_imParams.arrayLayers);
	DE_ASSERT(levelHi < m_imParams.levels);

	const int	coordSteps			= 1 << m_coordBits;
	const int	lodSteps			= 1 << m_mipmapBits;
	const int	levelLo				= (levelHi < m_imParams.levels - 1) ? levelHi + 1 : levelHi;

	IVec3		baseTexelHi			= baseTexelHiIn;
	IVec3		baseTexelLo			= baseTexelLoIn;
	IVec3		texelGridOffsetHi	= texelGridOffsetHiIn;
	IVec3		texelGridOffsetLo	= texelGridOffsetLoIn;
	deInt32		lodStepsMin			= 0;
	deInt32		lodStepsMax			= 0;

	getMipmapStepBounds(lodFracBounds, lodStepsMin, lodStepsMax);

	report << "Testing at base texel " << baseTexelHi << ", " << baseTexelLo << " offset " << texelGridOffsetHi << ", " << texelGridOffsetLo << "\n";

	Vec4 idealSampleHiMin;
	Vec4 idealSampleHiMax;
	Vec4 idealSampleLoMin;
	Vec4 idealSampleLoMax;

	// Get ideal samples at steps at each mipmap level

	if (filter == VK_FILTER_LINEAR)
	{
		// Adjust texel grid coordinates for linear filtering
		wrapTexelGridCoordLinear(baseTexelHi, texelGridOffsetHi, m_coordBits, m_imParams.dim);

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
			wrapTexelGridCoordLinear(baseTexelLo, texelGridOffsetLo, m_coordBits, m_imParams.dim);
		}

		const Vec3 roundedWeightsHi = texelGridOffsetHi.asFloat() / (float)coordSteps;
		const Vec3 roundedWeightsLo = texelGridOffsetLo.asFloat() / (float)coordSteps;

		report << "Computed weights: " << roundedWeightsHi << ", " << roundedWeightsLo << "\n";

	    getFilteredSample(baseTexelHi, roundedWeightsHi, layer, levelHi, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    getFilteredSample(baseTexelLo, roundedWeightsLo, layer, levelLo, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}
	else
	{
	    fetchTexel(baseTexelHi, layer, levelHi, VK_FILTER_NEAREST, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    fetchTexel(baseTexelLo, layer, levelLo, VK_FILTER_NEAREST, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}

	// Test ideal samples based on mipmap filtering mode

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		for (deInt32 lodStep = lodStepsMin; lodStep <= lodStepsMax; ++lodStep)
		{
			float weight = (float)lodStep / (float)lodSteps;

			report << "Testing at mipmap weight " << weight << "\n";

			Vec4 idealSampleMin;
			Vec4 idealSampleMax;

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval idealSampleLo(false, idealSampleLoMin[compNdx], idealSampleLoMax[compNdx]);
				const Interval idealSampleHi(false, idealSampleHiMin[compNdx], idealSampleHiMax[compNdx]);

				const Interval idealSample
					= m_filteringPrecision.roundOut(Interval(weight) * idealSampleLo + Interval(1.0f - weight) * idealSampleHi, false);

				idealSampleMin[compNdx] = (float)idealSample.lo();
				idealSampleMax[compNdx] = (float)idealSample.hi();
			}

			report << "Ideal sample: " << idealSampleMin << " through " << idealSampleMax << "\n";

			if (isInRange(result, idealSampleMin, idealSampleMax))
			{
				return true;
			}
			else
			{
				report << "Failed comparison\n";
			}
		}
	}
	else
	{
		if (isInRange(result, idealSampleHiMin, idealSampleHiMax))
		{
			return true;
		}
		else
		{
			report << "Failed comparison\n";
		}
	}

	return false;
}